

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

void __thiscall
helics::MessageDestOperator::MessageDestOperator
          (MessageDestOperator *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *userDestFunction)

{
  undefined8 uVar1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageDestOperator_004d0b18;
  *(undefined8 *)&(this->DestUpdateFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->DestUpdateFunction).super__Function_base._M_functor + 8) = 0;
  (this->DestUpdateFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->DestUpdateFunction)._M_invoker = userDestFunction->_M_invoker;
  if ((userDestFunction->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(userDestFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->DestUpdateFunction).super__Function_base._M_functor =
         *(undefined8 *)&(userDestFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->DestUpdateFunction).super__Function_base._M_functor + 8) = uVar1;
    (this->DestUpdateFunction).super__Function_base._M_manager =
         (userDestFunction->super__Function_base)._M_manager;
    (userDestFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userDestFunction->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

MessageDestOperator::MessageDestOperator(
    std::function<std::string(const std::string&, const std::string&)> userDestFunction):
    DestUpdateFunction(std::move(userDestFunction))
{
}